

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMove6<(moira::Instr)71,(moira::Mode)7,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)6,_2> dst;
  Ea<(moira::Mode)7,_2> src;
  Ea<(moira::Mode)6,_2> EStack_58;
  u32 local_44;
  ushort local_40;
  u32 local_3c;
  
  local_40 = op & 7;
  local_44 = *addr;
  local_3c = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)6,2>(&EStack_58,this,op >> 9 & 7,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)7,_2> *)&local_44);
  StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,&EStack_58);
  return;
}

Assistant:

void
Moira::dasmMove6(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <Mode::IX,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}